

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O1

void * deAlignedRealloc(void *ptr,size_t numBytes,size_t alignBytes)

{
  int iVar1;
  ulong uVar2;
  void *__dest;
  void *pvVar3;
  void *ptr_1;
  void *local_30;
  
  if (ptr == (void *)0x0) {
    local_30 = (void *)0x0;
    iVar1 = posix_memalign(&local_30,alignBytes + 7 & 0xfffffffffffffff8,numBytes);
    pvVar3 = (void *)0x0;
    if (iVar1 == 0) {
      pvVar3 = local_30;
    }
  }
  else if (numBytes == 0) {
    free(ptr);
    pvVar3 = (void *)0x0;
  }
  else {
    uVar2 = malloc_usable_size(ptr);
    pvVar3 = ptr;
    if (uVar2 < numBytes || numBytes * 2 < uVar2) {
      local_30 = (void *)0x0;
      iVar1 = posix_memalign(&local_30,alignBytes + 7 & 0xfffffffffffffff8,numBytes);
      __dest = (void *)0x0;
      if (iVar1 == 0) {
        __dest = local_30;
      }
      pvVar3 = (void *)0x0;
      if (__dest != (void *)0x0) {
        if (uVar2 < numBytes) {
          numBytes = uVar2;
        }
        memcpy(__dest,ptr,numBytes);
        free(ptr);
        pvVar3 = __dest;
      }
    }
  }
  return pvVar3;
}

Assistant:

void* deAlignedRealloc (void* ptr, size_t numBytes, size_t alignBytes)
{
#if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_WIN32)
	return _aligned_realloc(ptr, numBytes, alignBytes);

#elif (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC) || (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_POSIX)
	if (ptr)
	{
		if (numBytes > 0)
		{
#	if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC)
			const size_t				oldSize	= getAlignedAllocHeader(ptr)->numBytes;
#	else /* DE_ALIGNED_MALLOC_GENERIC */
			const size_t				oldSize	= malloc_usable_size(ptr);
#	endif

			DE_ASSERT(deIsAlignedPtr(ptr, alignBytes));

			if (oldSize < numBytes || oldSize > numBytes*2)
			{
				/* Create a new alloc if original is smaller, or more than twice the requested size */
				void* const	newPtr	= deAlignedMalloc(numBytes, alignBytes);

				if (newPtr)
				{
					const size_t	copyBytes	= numBytes < oldSize ? numBytes : oldSize;

					deMemcpy(newPtr, ptr, copyBytes);
					deAlignedFree(ptr);

					return newPtr;
				}
				else
					return DE_NULL;
			}
			else
				return ptr;
		}
		else
		{
			deAlignedFree(ptr);
			return DE_NULL;
		}
	}
	else
		return deAlignedMalloc(numBytes, alignBytes);

#else
#	error "Invalid DE_ALIGNED_MALLOC"
#endif
}